

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool art_node_init_iterator(art_ref_t ref,art_iterator_t *iterator,_Bool first)

{
  _Bool _Var1;
  art_iterator_t *node_00;
  byte in_DL;
  long in_RSI;
  art_ref_t in_RDI;
  art_indexed_child_t indexed_child;
  art_node_t *node;
  int in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  art_iterator_t *in_stack_ffffffffffffffa0;
  art_iterator_t *in_stack_ffffffffffffffa8;
  art_indexed_child_t in_stack_ffffffffffffffb0;
  art_indexed_child_t in_stack_ffffffffffffffc0;
  undefined8 local_30;
  undefined8 local_8;
  
  local_8 = in_RDI;
  while( true ) {
    _Var1 = art_is_leaf(0x10c220);
    if (((_Var1 ^ 0xffU) & 1) == 0) break;
    node_00 = (art_iterator_t *)
              art_deref((art_t *)in_stack_ffffffffffffffb0.child,
                        (art_ref_t)in_stack_ffffffffffffffa8);
    if ((in_DL & 1) == 0) {
      art_ref_typecode(local_8);
      in_stack_ffffffffffffffb0 =
           art_node_prev_child(node_00,(art_typecode_t)((uint)in_stack_ffffffffffffff9c >> 0x18),
                               in_stack_ffffffffffffff98);
      local_30 = in_stack_ffffffffffffffb0.child;
      in_stack_ffffffffffffffa0 = node_00;
    }
    else {
      art_ref_typecode(local_8);
      in_stack_ffffffffffffffc0 =
           art_node_next_child(in_stack_ffffffffffffffa0,
                               (art_typecode_t)((uint)in_stack_ffffffffffffff9c >> 0x18),
                               in_stack_ffffffffffffff98);
      local_30 = in_stack_ffffffffffffffc0.child;
      in_stack_ffffffffffffffa8 = node_00;
    }
    art_iterator_down((art_iterator_t *)in_stack_ffffffffffffffc0.child,
                      in_stack_ffffffffffffffb0._8_8_,in_stack_ffffffffffffffb0.child._7_1_);
    local_8 = local_30;
  }
  *(art_ref_t *)(in_RSI + 0x20 + (ulong)*(byte *)(in_RSI + 0x19) * 0x10) = local_8;
  *(undefined1 *)(in_RSI + (ulong)*(byte *)(in_RSI + 0x19) * 0x10 + 0x28) = 0;
  _Var1 = art_iterator_valid_loc
                    (in_stack_ffffffffffffffa0,
                     CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  return _Var1;
}

Assistant:

static bool art_node_init_iterator(art_ref_t ref, art_iterator_t *iterator,
                                   bool first) {
    while (!art_is_leaf(ref)) {
        art_node_t *node = art_deref(iterator->art, ref);
        art_indexed_child_t indexed_child;
        if (first) {
            indexed_child =
                art_node_next_child(node, art_ref_typecode(ref), -1);
        } else {
            indexed_child =
                art_node_prev_child(node, art_ref_typecode(ref), 256);
        }
        art_iterator_down(iterator, ref, indexed_child.index);
        ref = indexed_child.child;
    }
    // We're at a leaf.
    iterator->frames[iterator->frame].ref = ref;
    iterator->frames[iterator->frame].index_in_node = 0;  // Should not matter.
    return art_iterator_valid_loc(iterator, ref);
}